

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O2

void maybe_free_watcher_list(watcher_list *w,uv_loop_t *loop)

{
  int iVar1;
  undefined4 uVar2;
  watcher_list *pwVar3;
  void **ppvVar4;
  watcher_list *pwVar5;
  watcher_list *pwVar6;
  watcher_list *pwVar7;
  watcher_list *old;
  int iVar8;
  watcher_list *pwVar9;
  void **ppvVar10;
  watcher_list *pwVar11;
  
  if ((w->iterating != 0) || (w->watchers != (void **)w->watchers[0])) {
    return;
  }
  ppvVar4 = &loop->inotify_watchers;
  pwVar9 = (w->entry).rbe_left;
  pwVar5 = (w->entry).rbe_right;
  if (pwVar9 == (watcher_list *)0x0) {
    pwVar6 = (w->entry).rbe_parent;
    iVar8 = (w->entry).rbe_color;
    if (pwVar5 != (watcher_list *)0x0) goto LAB_00213710;
    pwVar5 = (watcher_list *)0x0;
  }
  else {
    if (pwVar5 != (watcher_list *)0x0) {
      do {
        pwVar9 = pwVar5;
        pwVar5 = (pwVar9->entry).rbe_left;
      } while (pwVar5 != (watcher_list *)0x0);
      pwVar5 = (pwVar9->entry).rbe_right;
      pwVar6 = (pwVar9->entry).rbe_parent;
      iVar8 = (pwVar9->entry).rbe_color;
      if (pwVar5 != (watcher_list *)0x0) {
        (pwVar5->entry).rbe_parent = pwVar6;
      }
      ppvVar10 = ppvVar4;
      if (pwVar6 != (watcher_list *)0x0) {
        ppvVar10 = pwVar6->watchers + ((ulong)((pwVar6->entry).rbe_left != pwVar9) - 4);
      }
      *ppvVar10 = pwVar5;
      if ((pwVar9->entry).rbe_parent == w) {
        pwVar6 = pwVar9;
      }
      pwVar11 = (w->entry).rbe_left;
      pwVar7 = (w->entry).rbe_right;
      iVar1 = (w->entry).rbe_color;
      uVar2 = *(undefined4 *)&(w->entry).field_0x1c;
      (pwVar9->entry).rbe_parent = (w->entry).rbe_parent;
      (pwVar9->entry).rbe_color = iVar1;
      *(undefined4 *)&(pwVar9->entry).field_0x1c = uVar2;
      (pwVar9->entry).rbe_left = pwVar11;
      (pwVar9->entry).rbe_right = pwVar7;
      pwVar11 = (w->entry).rbe_parent;
      ppvVar10 = ppvVar4;
      if (pwVar11 != (watcher_list *)0x0) {
        ppvVar10 = pwVar11->watchers + ((ulong)((pwVar11->entry).rbe_left != w) - 4);
      }
      *ppvVar10 = pwVar9;
      (((w->entry).rbe_left)->entry).rbe_parent = pwVar9;
      pwVar11 = (w->entry).rbe_right;
      if (pwVar11 != (watcher_list *)0x0) {
        (pwVar11->entry).rbe_parent = pwVar9;
      }
      goto LAB_00213731;
    }
    pwVar6 = (w->entry).rbe_parent;
    iVar8 = (w->entry).rbe_color;
    pwVar5 = pwVar9;
LAB_00213710:
    (pwVar5->entry).rbe_parent = pwVar6;
  }
  ppvVar10 = ppvVar4;
  if (pwVar6 != (watcher_list *)0x0) {
    ppvVar10 = pwVar6->watchers + ((ulong)((pwVar6->entry).rbe_left != w) - 4);
  }
  *ppvVar10 = pwVar5;
LAB_00213731:
  if (iVar8 == 0) {
    while( true ) {
      if ((pwVar5 != (watcher_list *)0x0) && ((pwVar5->entry).rbe_color != 0)) goto LAB_002139de;
      pwVar9 = (watcher_list *)*ppvVar4;
      if (pwVar5 == pwVar9) goto LAB_002139d9;
      pwVar11 = (pwVar6->entry).rbe_left;
      if (pwVar11 == pwVar5) {
        pwVar5 = (pwVar6->entry).rbe_right;
        pwVar7 = pwVar5;
        if ((pwVar5->entry).rbe_color == 1) {
          (pwVar5->entry).rbe_color = 0;
          (pwVar6->entry).rbe_color = 1;
          pwVar7 = (pwVar5->entry).rbe_left;
          (pwVar6->entry).rbe_right = pwVar7;
          if (pwVar7 != (watcher_list *)0x0) {
            (pwVar7->entry).rbe_parent = pwVar6;
          }
          pwVar11 = (pwVar6->entry).rbe_parent;
          (pwVar5->entry).rbe_parent = pwVar11;
          if (pwVar11 == (watcher_list *)0x0) {
            *ppvVar4 = pwVar5;
            pwVar9 = pwVar5;
          }
          else if (pwVar6 == (pwVar11->entry).rbe_left) {
            (pwVar11->entry).rbe_left = pwVar5;
          }
          else {
            (pwVar11->entry).rbe_right = pwVar5;
            pwVar7 = (pwVar6->entry).rbe_right;
          }
          (pwVar5->entry).rbe_left = pwVar6;
          (pwVar6->entry).rbe_parent = pwVar5;
        }
        pwVar5 = (pwVar7->entry).rbe_left;
        if ((pwVar5 == (watcher_list *)0x0) || ((pwVar5->entry).rbe_color == 0)) {
          pwVar11 = (pwVar7->entry).rbe_right;
          if ((pwVar11 == (watcher_list *)0x0) || ((pwVar11->entry).rbe_color == 0))
          goto LAB_00213842;
        }
        else {
          pwVar11 = (pwVar7->entry).rbe_right;
          if ((pwVar11 == (watcher_list *)0x0) || ((pwVar11->entry).rbe_color == 0)) {
            (pwVar5->entry).rbe_color = 0;
            (pwVar7->entry).rbe_color = 1;
            pwVar11 = (pwVar5->entry).rbe_right;
            (pwVar7->entry).rbe_left = pwVar11;
            if (pwVar11 != (watcher_list *)0x0) {
              (pwVar11->entry).rbe_parent = pwVar7;
            }
            pwVar11 = (pwVar7->entry).rbe_parent;
            (pwVar5->entry).rbe_parent = pwVar11;
            pwVar3 = pwVar5;
            ppvVar10 = ppvVar4;
            if (pwVar11 != (watcher_list *)0x0) {
              ppvVar10 = pwVar11->watchers + ((ulong)(pwVar7 != (pwVar11->entry).rbe_left) - 4);
              pwVar3 = pwVar9;
            }
            pwVar9 = pwVar3;
            *ppvVar10 = pwVar5;
            (pwVar5->entry).rbe_right = pwVar7;
            (pwVar7->entry).rbe_parent = pwVar5;
            pwVar7 = (pwVar6->entry).rbe_right;
            pwVar11 = (pwVar7->entry).rbe_right;
          }
        }
        (pwVar7->entry).rbe_color = (pwVar6->entry).rbe_color;
        (pwVar6->entry).rbe_color = 0;
        if (pwVar11 != (watcher_list *)0x0) {
          (pwVar11->entry).rbe_color = 0;
        }
        pwVar5 = (pwVar7->entry).rbe_left;
        (pwVar6->entry).rbe_right = pwVar5;
        if (pwVar5 != (watcher_list *)0x0) {
          (pwVar5->entry).rbe_parent = pwVar6;
        }
        pwVar11 = (pwVar6->entry).rbe_parent;
        (pwVar7->entry).rbe_parent = pwVar11;
        pwVar5 = pwVar7;
        if (pwVar11 != (watcher_list *)0x0) {
          ppvVar4 = pwVar11->watchers + ((ulong)(pwVar6 != (pwVar11->entry).rbe_left) - 4);
          pwVar5 = pwVar9;
        }
        *ppvVar4 = pwVar7;
        (pwVar7->entry).rbe_left = pwVar6;
        goto LAB_002139d5;
      }
      pwVar7 = pwVar11;
      if ((pwVar11->entry).rbe_color == 1) {
        (pwVar11->entry).rbe_color = 0;
        (pwVar6->entry).rbe_color = 1;
        pwVar7 = (pwVar11->entry).rbe_right;
        (pwVar6->entry).rbe_left = pwVar7;
        if (pwVar7 != (watcher_list *)0x0) {
          (pwVar7->entry).rbe_parent = pwVar6;
        }
        pwVar5 = (pwVar6->entry).rbe_parent;
        (pwVar11->entry).rbe_parent = pwVar5;
        if (pwVar5 == (watcher_list *)0x0) {
          *ppvVar4 = pwVar11;
          pwVar9 = pwVar11;
        }
        else if (pwVar6 == (pwVar5->entry).rbe_left) {
          (pwVar5->entry).rbe_left = pwVar11;
          pwVar7 = (pwVar6->entry).rbe_left;
        }
        else {
          (pwVar5->entry).rbe_right = pwVar11;
        }
        (pwVar11->entry).rbe_right = pwVar6;
        (pwVar6->entry).rbe_parent = pwVar11;
      }
      pwVar5 = (pwVar7->entry).rbe_left;
      if ((pwVar5 != (watcher_list *)0x0) && ((pwVar5->entry).rbe_color != 0)) goto LAB_002138d3;
      pwVar11 = (pwVar7->entry).rbe_right;
      if ((pwVar11 != (watcher_list *)0x0) && ((pwVar11->entry).rbe_color != 0)) break;
LAB_00213842:
      (pwVar7->entry).rbe_color = 1;
      pwVar5 = pwVar6;
      pwVar6 = (pwVar6->entry).rbe_parent;
    }
    if ((pwVar5 == (watcher_list *)0x0) || ((pwVar5->entry).rbe_color == 0)) {
      (pwVar11->entry).rbe_color = 0;
      (pwVar7->entry).rbe_color = 1;
      pwVar5 = (pwVar11->entry).rbe_left;
      (pwVar7->entry).rbe_right = pwVar5;
      if (pwVar5 != (watcher_list *)0x0) {
        (pwVar5->entry).rbe_parent = pwVar7;
      }
      pwVar5 = (pwVar7->entry).rbe_parent;
      (pwVar11->entry).rbe_parent = pwVar5;
      pwVar3 = pwVar11;
      ppvVar10 = ppvVar4;
      if (pwVar5 != (watcher_list *)0x0) {
        ppvVar10 = pwVar5->watchers + ((ulong)(pwVar7 != (pwVar5->entry).rbe_left) - 4);
        pwVar3 = pwVar9;
      }
      pwVar9 = pwVar3;
      *ppvVar10 = pwVar11;
      (pwVar11->entry).rbe_left = pwVar7;
      (pwVar7->entry).rbe_parent = pwVar11;
      pwVar7 = (pwVar6->entry).rbe_left;
      pwVar5 = (pwVar7->entry).rbe_left;
    }
LAB_002138d3:
    (pwVar7->entry).rbe_color = (pwVar6->entry).rbe_color;
    (pwVar6->entry).rbe_color = 0;
    if (pwVar5 != (watcher_list *)0x0) {
      (pwVar5->entry).rbe_color = 0;
    }
    pwVar5 = (pwVar7->entry).rbe_right;
    (pwVar6->entry).rbe_left = pwVar5;
    if (pwVar5 != (watcher_list *)0x0) {
      (pwVar5->entry).rbe_parent = pwVar6;
    }
    pwVar11 = (pwVar6->entry).rbe_parent;
    (pwVar7->entry).rbe_parent = pwVar11;
    pwVar5 = pwVar7;
    if (pwVar11 != (watcher_list *)0x0) {
      ppvVar4 = pwVar11->watchers + ((ulong)(pwVar6 != (pwVar11->entry).rbe_left) - 4);
      pwVar5 = pwVar9;
    }
    *ppvVar4 = pwVar7;
    (pwVar7->entry).rbe_right = pwVar6;
LAB_002139d5:
    (pwVar6->entry).rbe_parent = pwVar7;
LAB_002139d9:
    if (pwVar5 != (watcher_list *)0x0) {
LAB_002139de:
      (pwVar5->entry).rbe_color = 0;
    }
  }
  inotify_rm_watch(loop->inotify_fd,w->wd);
  uv__free(w);
  return;
}

Assistant:

static void maybe_free_watcher_list(struct watcher_list* w, uv_loop_t* loop) {
  /* if the watcher_list->watchers is being iterated over, we can't free it. */
  if ((!w->iterating) && QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&loop->inotify_watchers), w);
    inotify_rm_watch(loop->inotify_fd, w->wd);
    uv__free(w);
  }
}